

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

CompressionFunction * duckdb::ConstantGetFunctionValidity(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_CONSTANT;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = (compression_init_analyze_t)0x0;
  in_RDI->analyze = (compression_analyze_t)0x0;
  in_RDI->final_analyze = (compression_final_analyze_t)0x0;
  in_RDI->init_compression = (compression_init_compression_t)0x0;
  in_RDI->compress = (compression_compress_data_t)0x0;
  in_RDI->compress_finalize = (compression_compress_finalize_t)0x0;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = ConstantInitScan;
  in_RDI->scan_vector = ConstantScanFunctionValidity;
  in_RDI->scan_partial = ConstantScanPartialValidity;
  in_RDI->select = ConstantSelectValidity;
  in_RDI->filter = ConstantFilterValidity;
  in_RDI->fetch_row = ConstantFetchRowValidity;
  in_RDI->skip = UncompressedFunctions::EmptySkip;
  in_RDI->init_segment = (compression_init_segment_t)0x0;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  *(undefined8 *)((long)&in_RDI->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&in_RDI->get_segment_info + 1) = 0;
  return in_RDI;
}

Assistant:

CompressionFunction ConstantGetFunctionValidity(PhysicalType data_type) {
	D_ASSERT(data_type == PhysicalType::BIT);
	return CompressionFunction(CompressionType::COMPRESSION_CONSTANT, data_type, nullptr, nullptr, nullptr, nullptr,
	                           nullptr, nullptr, ConstantInitScan, ConstantScanFunctionValidity,
	                           ConstantScanPartialValidity, ConstantFetchRowValidity, UncompressedFunctions::EmptySkip,
	                           nullptr, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr,
	                           ConstantSelectValidity, ConstantFilterValidity);
}